

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O2

void aggregate_draw_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Am_Value *pAVar6;
  Am_State_Store *this;
  uint x_offset_00;
  uint y_offset_00;
  Am_Object item;
  Am_Object local_48;
  Am_Value_List components;
  
  pAVar6 = Am_Object::Get(self,100,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(self,0x65,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(self,0x66,0);
  uVar4 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(self,0x67,0);
  uVar5 = Am_Value::operator_cast_to_int(pAVar6);
  if (uVar5 != 0 && uVar4 != 0) {
    x_offset_00 = iVar2 + x_offset;
    y_offset_00 = iVar3 + y_offset;
    (*drawonable->_vptr_Am_Drawonable[0x21])
              (drawonable,(ulong)x_offset_00,(ulong)y_offset_00,(ulong)uVar4,(ulong)uVar5);
    pAVar6 = Am_Object::Get(self,0x82,0);
    Am_Value_List::Am_Value_List(&components,pAVar6);
    item.data = (Am_Object_Data *)0x0;
    Am_Value_List::Start(&components);
    while( true ) {
      bVar1 = Am_Value_List::Last(&components);
      if (bVar1) break;
      pAVar6 = Am_Value_List::Get(&components);
      Am_Object::operator=(&item,pAVar6);
      pAVar6 = Am_Object::Get(&item,0x7d8,0);
      this = (Am_State_Store *)Am_Value::operator_cast_to_void_(pAVar6);
      bVar1 = Am_State_Store::Visible(this,drawonable,x_offset_00,y_offset_00);
      if (bVar1) {
        Am_Object::Am_Object(&local_48,&item);
        Am_Draw(&local_48,drawonable,x_offset_00,y_offset_00);
        Am_Object::~Am_Object(&local_48);
      }
      Am_Value_List::Next(&components);
    }
    (*drawonable->_vptr_Am_Drawonable[0x22])(drawonable);
    Am_Object::~Am_Object(&item);
    Am_Value_List::~Am_Value_List(&components);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, aggregate_draw,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  if (width && height) {
    drawonable->Push_Clip(left, top, width, height);
    //// DEBUG
    //std::cout << "aggregate " << *self << " clip mask <l" << left << " t" << top
    //     << " w" << width << " h" << height << ">" <<std::endl;
    Am_Value_List components = self.Get(Am_GRAPHICAL_PARTS);
    Am_Object item;
    for (components.Start(); !components.Last(); components.Next()) {
      item = components.Get();
      Am_State_Store *state = Am_State_Store::Narrow(item.Get(Am_PREV_STATE));
      if (state->Visible(drawonable, left, top))
        Am_Draw(item, drawonable, left, top);
    }
    drawonable->Pop_Clip();
  }
}